

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mser.c
# Opt level: O2

void drawEllipse(float *region,int width,int height,int depth,uchar *bits,uint8_t *color)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined4 extraout_EDX;
  uint uVar3;
  uint uVar4;
  float fVar5;
  int iVar6;
  float fVar7;
  int iVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float local_a8;
  float fStack_a4;
  float local_68;
  float fStack_64;
  float local_48;
  float fStack_44;
  
  uVar1 = *(undefined8 *)region;
  fVar7 = region[3];
  fVar5 = region[4];
  fVar12 = region[2] + fVar5;
  fVar9 = region[2] - fVar5;
  fVar9 = fVar7 * 4.0 * fVar7 + fVar9 * fVar9;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  fVar11 = (fVar12 + fVar9) * 0.5;
  local_a8 = (fVar12 - fVar9) * 0.5;
  if (fVar11 < 0.0) {
    local_68 = sqrtf(fVar11);
  }
  else {
    local_68 = SQRT(fVar11);
  }
  if (local_a8 < 0.0) {
    fStack_a4 = sqrtf(local_a8);
  }
  else {
    fStack_a4 = SQRT(local_a8);
  }
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    fVar11 = fVar11 - fVar5;
    local_a8 = local_a8 - fVar5;
    fStack_64 = local_68 / SQRT(fVar11 * fVar11 + fVar7 * fVar7);
    local_68 = fStack_64 * fVar11;
    fStack_64 = fStack_64 * fVar7;
    fStack_a4 = fStack_a4 / SQRT(local_a8 * local_a8 + fVar7 * fVar7);
    local_a8 = fStack_a4 * local_a8;
    fStack_a4 = fStack_a4 * fVar7;
  }
  else {
    local_a8 = 0.0;
    fStack_64 = 0.0;
  }
  uVar4 = 3;
  if (depth < 3) {
    uVar4 = depth;
  }
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  for (fVar7 = 0.0; fVar7 < 6.2831855; fVar7 = fVar7 + 0.001) {
    fVar5 = cosf(fVar7);
    fVar9 = sinf(fVar7);
    fVar12 = cosf(fVar7);
    fVar11 = sinf(fVar7);
    fVar5 = fVar5 * local_68 + fVar9 * local_a8;
    fVar9 = fVar12 * fStack_64 + fVar11 * fStack_a4;
    local_48 = (float)uVar1;
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    iVar6 = (int)(fVar5 + fVar5 + local_48 + 0.5);
    iVar8 = (int)(fVar9 + fVar9 + fStack_44 + 0.5);
    if (-1 < iVar6) {
      auVar10._0_4_ = -(uint)(iVar6 < width);
      auVar10._4_4_ = auVar10._0_4_;
      auVar10._8_4_ = -(uint)(iVar8 < height);
      auVar10._12_4_ = -(uint)(iVar8 < height);
      uVar3 = movmskpd(extraout_EDX,auVar10);
      if ((((uVar3 & 1) != 0) && (-1 < iVar8)) && ((byte)((byte)uVar3 >> 1) != 0)) {
        for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
          bits[uVar2 + (long)((iVar8 * width + iVar6) * depth)] = color[uVar2];
        }
      }
    }
  }
  return;
}

Assistant:

void drawEllipse(const float *region, int width, int height, int depth, unsigned char *bits, const uint8_t *color) {
    /* Centroid (mean) */
    const float x = region[0];
    const float y = region[1];

    /* Covariance matrix [a b; b c] */
    const float a = region[2];
    const float b = region[3];
    const float c = region[4];

    /* Eigenvalues of the covariance matrix */
    const float d = a + c;
    const float e = a - c;
    const float f = sqrtf(4.0f * b * b + e * e);
    const float e0 = (d + f) / 2.0f;       /* First eigenvalue */
    const float e1 = (d - f) / 2.0f;       /* Second eigenvalue */

    /* Desired norm of the eigenvectors */
    const float e0sq = sqrtf(e0);
    const float e1sq = sqrtf(e1);

    /* Eigenvectors */
    float v0x = e0sq;
    float v0y = 0.0f;
    float v1x = 0.0f;
    float v1y = e1sq;

    if (b) {
        v0x = e0 - c;
        v0y = b;
        v1x = e1 - c;
        v1y = b;

        /* Normalize the eigenvectors */
        const float n0 = e0sq / sqrtf(v0x * v0x + v0y * v0y);
        v0x *= n0;
        v0y *= n0;

        const float n1 = e1sq / sqrtf(v1x * v1x + v1y * v1y);
        v1x *= n1;
        v1y *= n1;
    }

    for (float t = 0.0f; t < 2.0f * M_PI; t += 0.001f) {
        int x2 = (int) (x + (cosf(t) * v0x + sinf(t) * v1x) * 2.0f + 0.5f);
        int y2 = (int) (y + (cosf(t) * v0y + sinf(t) * v1y) * 2.0f + 0.5f);

        if ((x2 >= 0) && (x2 < width) && (y2 >= 0) && (y2 < height))
            for (int i = 0; i < min(depth, 3); ++i)
                bits[(y2 * width + x2) * depth + i] = color[i];
    }
}